

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,BaseTextGenerator *generator,
          int recursion_budget)

{
  anon_union_8_5_2195ba05_for_data_ aVar1;
  anon_union_8_5_2195ba05_for_data_ this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_reference pUVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  undefined4 in_register_0000000c;
  undefined8 uVar8;
  int index;
  char *pcVar9;
  string_view src;
  UnknownFieldSet embedded_unknown_fields;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_b8;
  undefined8 local_a8;
  anon_union_8_5_2195ba05_for_data_ local_a0;
  long local_98;
  undefined8 local_90;
  uint32_t local_88;
  undefined7 local_84;
  undefined4 uStack_7d;
  uint32_t local_78;
  undefined8 local_74;
  int local_6c;
  int local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  string local_50;
  
  local_a8 = CONCAT44(in_register_0000000c,recursion_budget);
  iVar3 = internal::SooRep::size
                    ((SooRep *)unknown_fields,
                     (undefined1  [16])
                     ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                     (undefined1  [16])0x4) == (undefined1  [16])0x0);
  if (0 < iVar3) {
    iVar3 = (int)local_a8 + -1;
    index = 0;
    do {
      pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,index);
      switch(pUVar5->type_) {
      case 0:
        local_a0.fixed32 = pUVar5->number_;
        OutOfLinePrintString<int>(generator,(int *)&local_a0.fixed32);
        (*generator->_vptr_BaseTextGenerator[6])(generator,2,": ");
        if (this->redact_debug_string_ == true) {
          OutOfLinePrintString<char[16]>(generator,(char (*) [16])"UNKNOWN_VARINT ");
          goto LAB_00250743;
        }
        if (pUVar5->type_ != 0) {
          __assert_fail("type() == TYPE_VARINT",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x164,"uint64_t google::protobuf::UnknownField::varint() const");
        }
        local_a0 = pUVar5->data_;
        OutOfLinePrintString<unsigned_long>(generator,&local_a0.varint);
        goto LAB_0025088e;
      case 1:
        local_a0.fixed32 = pUVar5->number_;
        OutOfLinePrintString<int>(generator,(int *)&local_a0.fixed32);
        p_Var6 = generator->_vptr_BaseTextGenerator[7];
        if (this->redact_debug_string_ != true) {
          (*p_Var6)(generator,2,": ",2,"0x");
          if (pUVar5->type_ != 1) {
            __assert_fail("type() == TYPE_FIXED32",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                          ,0x168,"uint32_t google::protobuf::UnknownField::fixed32() const");
          }
          local_a0.varint._4_4_ = 0;
          local_a0.fixed32 = (pUVar5->data_).fixed32;
          local_98 = CONCAT62(local_98._2_6_,0x3008);
LAB_00250883:
          OutOfLinePrintString<absl::lts_20250127::Hex>(generator,(Hex *)&local_a0);
          goto LAB_0025088e;
        }
        pcVar9 = "UNKNOWN_FIXED32 ";
        goto LAB_00250741;
      case 2:
        local_a0.fixed32 = pUVar5->number_;
        OutOfLinePrintString<int>(generator,(int *)&local_a0.fixed32);
        p_Var6 = generator->_vptr_BaseTextGenerator[7];
        if (this->redact_debug_string_ != true) {
          (*p_Var6)(generator,2,": ",2,"0x");
          if (pUVar5->type_ != 2) {
            __assert_fail("type() == TYPE_FIXED64",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                          ,0x16c,"uint64_t google::protobuf::UnknownField::fixed64() const");
          }
          local_a0 = pUVar5->data_;
          local_98 = CONCAT62(local_98._2_6_,0x3010);
          goto LAB_00250883;
        }
        pcVar9 = "UNKNOWN_FIXED64 ";
LAB_00250741:
        (*p_Var6)(generator,2,": ",0x10,pcVar9);
LAB_00250743:
        OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                  (generator,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   (anonymous_namespace)::kFieldValueReplacement);
LAB_0025088e:
        if (this->single_line_mode_ == true) {
          pcVar9 = " ";
        }
        else {
          pcVar9 = "\n";
        }
        (*generator->_vptr_BaseTextGenerator[5])(generator,pcVar9,1);
        break;
      case 3:
        local_a0.fixed32 = pUVar5->number_;
        OutOfLinePrintString<int>(generator,(int *)&local_a0.fixed32);
        if (pUVar5->type_ != 3) {
          __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x170,
                        "absl::string_view google::protobuf::UnknownField::length_delimited() const"
                       );
        }
        aVar1 = (anon_union_8_5_2195ba05_for_data_)
                ((anon_union_8_5_2195ba05_for_data_ *)(pUVar5->data_).string_value)->string_value;
        this_00 = ((anon_union_8_5_2195ba05_for_data_ *)(pUVar5->data_).string_value)[1];
        local_88 = this_00.fixed32;
        local_98 = (long)&((aVar1.string_value)->_M_dataplus)._M_p + (long)(int)local_88;
        local_90 = 0;
        local_84 = 0;
        uStack_7d = 0;
        local_74 = 0x7fffffff00000000;
        local_60 = 0;
        uStack_58 = 0;
        local_6c = (int)local_a8;
        local_b8.long_rep.elements_int = 0;
        local_b8.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
        local_a0 = aVar1;
        local_78 = local_88;
        local_68 = local_6c;
        if (((local_6c < 1) || ((lts_20250127 *)this_00.varint == (lts_20250127 *)0x0)) ||
           (bVar2 = UnknownFieldSet::ParseFromCodedStream
                              ((UnknownFieldSet *)&local_b8.long_rep,(CodedInputStream *)&local_a0),
           !bVar2)) {
          if (this->redact_debug_string_ == true) {
            (*generator->_vptr_BaseTextGenerator[7])(generator,2,": ",0xf,"UNKNOWN_STRING ");
            OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                      (generator,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       (anonymous_namespace)::kFieldValueReplacement);
            goto LAB_00250796;
          }
          pcVar9 = (char *)0x1;
          (*generator->_vptr_BaseTextGenerator[7])(generator,2,": ",1,"\"");
          src._M_str = pcVar9;
          src._M_len = aVar1.varint;
          absl::lts_20250127::CEscape_abi_cxx11_(&local_50,(lts_20250127 *)this_00.string_value,src)
          ;
          (*generator->_vptr_BaseTextGenerator[5])
                    (generator,local_50._M_dataplus._M_p,local_50._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pp_Var7 = generator->_vptr_BaseTextGenerator + 5;
          pcVar9 = "\"\n";
          if (this->single_line_mode_ != false) {
            pcVar9 = "\" ";
          }
          uVar8 = 2;
        }
        else if (this->redact_debug_string_ == true) {
          (*generator->_vptr_BaseTextGenerator[7])(generator,2,": ",0x10,"UNKNOWN_MESSAGE ");
          OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
                    (generator,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     (anonymous_namespace)::kFieldValueReplacement);
LAB_00250796:
          pp_Var7 = generator->_vptr_BaseTextGenerator + 5;
          pcVar9 = "\n";
          if (this->single_line_mode_ != false) {
            pcVar9 = " ";
          }
          uVar8 = 1;
        }
        else {
          if (this->single_line_mode_ == true) {
            (*generator->_vptr_BaseTextGenerator[7])(generator,1," ",2,"{ ");
          }
          else {
            (*generator->_vptr_BaseTextGenerator[7])(generator,1," ",2,"{\n");
            (*generator->_vptr_BaseTextGenerator[2])(generator);
          }
          PrintUnknownFields(this,(UnknownFieldSet *)&local_b8.long_rep,generator,iVar3);
          if (this->single_line_mode_ == true) {
            pp_Var7 = generator->_vptr_BaseTextGenerator + 5;
            uVar8 = 2;
            pcVar9 = "} ";
          }
          else {
            (*generator->_vptr_BaseTextGenerator[3])(generator);
            pp_Var7 = generator->_vptr_BaseTextGenerator + 5;
            uVar8 = 2;
            pcVar9 = "}\n";
          }
        }
        (**pp_Var7)(generator,pcVar9,uVar8);
        iVar4 = internal::SooRep::size
                          ((SooRep *)&local_b8.long_rep,(local_b8.long_rep.elements_int & 4) == 0);
        if (iVar4 != 0) {
          UnknownFieldSet::ClearFallback((UnknownFieldSet *)&local_b8.long_rep);
        }
        RepeatedField<google::protobuf::UnknownField>::~RepeatedField
                  ((RepeatedField<google::protobuf::UnknownField> *)&local_b8.long_rep);
        io::CodedInputStream::~CodedInputStream((CodedInputStream *)&local_a0);
        break;
      case 4:
        local_a0.fixed32 = pUVar5->number_;
        OutOfLinePrintString<int>(generator,(int *)&local_a0.fixed32);
        if (this->redact_debug_string_ == true) {
          (*generator->_vptr_BaseTextGenerator[7])(generator,2,": ",0xe,"UNKNOWN_GROUP ");
          goto LAB_00250743;
        }
        if (this->single_line_mode_ == true) {
          (*generator->_vptr_BaseTextGenerator[7])(generator,1," ",2,"{ ");
        }
        else {
          (*generator->_vptr_BaseTextGenerator[7])(generator,1," ",2,"{\n");
          (*generator->_vptr_BaseTextGenerator[2])(generator);
        }
        if (pUVar5->type_ != 4) {
          __assert_fail("type() == TYPE_GROUP",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x174,
                        "const UnknownFieldSet &google::protobuf::UnknownField::group() const");
        }
        PrintUnknownFields(this,(pUVar5->data_).group,generator,iVar3);
        pp_Var7 = generator->_vptr_BaseTextGenerator;
        if (this->single_line_mode_ == true) {
          pcVar9 = "} ";
        }
        else {
          (*pp_Var7[3])(generator);
          pp_Var7 = generator->_vptr_BaseTextGenerator;
          pcVar9 = "}\n";
        }
        (*pp_Var7[5])(generator,pcVar9,2);
      }
      index = index + 1;
      iVar4 = internal::SooRep::size
                        ((SooRep *)unknown_fields,
                         (undefined1  [16])
                         ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    } while (index < iVar4);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, BaseTextGenerator* generator,
    int recursion_budget) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        OutOfLinePrintString(generator, field.number());
        generator->PrintMaybeWithMarker(MarkerToken(), ": ");
        if (redact_debug_string_) {
          OutOfLinePrintString(generator, "UNKNOWN_VARINT ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          OutOfLinePrintString(generator, field.varint());
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_FIXED32 ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "0x");
          OutOfLinePrintString(generator,
                               absl::Hex(field.fixed32(), absl::kZeroPad8));
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_FIXED64 ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "0x");
          OutOfLinePrintString(generator,
                               absl::Hex(field.fixed64(), absl::kZeroPad16));
        }
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        OutOfLinePrintString(generator, field.number());
        const absl::string_view value = field.length_delimited();
        // We create a CodedInputStream so that we can adhere to our recursion
        // budget when we attempt to parse the data. UnknownFieldSet parsing is
        // recursive because of groups.
        io::CodedInputStream input_stream(
            reinterpret_cast<const uint8_t*>(value.data()), value.size());
        input_stream.SetRecursionLimit(recursion_budget);
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && recursion_budget > 0 &&
            embedded_unknown_fields.ParseFromCodedStream(&input_stream)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (redact_debug_string_) {
            generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                            "UNKNOWN_MESSAGE ");
            OutOfLinePrintString(generator, kFieldValueReplacement);
            if (single_line_mode_) {
              generator->PrintLiteral(" ");
            } else {
              generator->PrintLiteral("\n");
            }
            break;
          }
          if (single_line_mode_) {
            generator->PrintMaybeWithMarker(MarkerToken(), " ", "{ ");
          } else {
            generator->PrintMaybeWithMarker(MarkerToken(), " ", "{\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator,
                             recursion_budget - 1);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message (or we ran out of
          // recursion budget). So it is probably just a plain string.
          if (redact_debug_string_) {
            generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                            "UNKNOWN_STRING ");
            OutOfLinePrintString(generator, kFieldValueReplacement);
            if (single_line_mode_) {
              generator->PrintLiteral(" ");
            } else {
              generator->PrintLiteral("\n");
            }
            break;
          }
          generator->PrintMaybeWithMarker(MarkerToken(), ": ", "\"");
          generator->PrintString(absl::CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        OutOfLinePrintString(generator, field.number());
        if (redact_debug_string_) {
          generator->PrintMaybeWithMarker(MarkerToken(), ": ",
                                          "UNKNOWN_GROUP ");
          OutOfLinePrintString(generator, kFieldValueReplacement);
          if (single_line_mode_) {
            generator->PrintLiteral(" ");
          } else {
            generator->PrintLiteral("\n");
          }
          break;
        }
        if (single_line_mode_) {
          generator->PrintMaybeWithMarker(MarkerToken(), " ", "{ ");
        } else {
          generator->PrintMaybeWithMarker(MarkerToken(), " ", "{\n");
          generator->Indent();
        }
        // For groups, we recurse without checking the budget. This is OK,
        // because if the groups were too deeply nested then we would have
        // already rejected the message when we originally parsed it.
        PrintUnknownFields(field.group(), generator, recursion_budget - 1);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}